

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XInclude.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  char *__s;
  char cVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  size_t sVar6;
  long lVar7;
  LocalFileFormatTarget *this;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  XIncludeErrorHandler errorHandler;
  XMLCh errText [2048];
  
  iVar2 = 0;
  bVar10 = 1 < argC;
  if (1 < argC) {
    pcVar8 = argV[1];
    iVar2 = strcmp(pcVar8,"-?");
    if (iVar2 != 0) {
      uVar9 = 2;
      do {
        iVar2 = strcmp(pcVar8,"-h");
        if (iVar2 == 0) break;
        bVar10 = uVar9 < (uint)argC;
        if (uVar9 == (uint)argC) {
          iVar2 = 0;
          goto LAB_0010239f;
        }
        pcVar8 = argV[uVar9];
        iVar2 = strcmp(pcVar8,"-?");
        uVar9 = uVar9 + 1;
      } while (iVar2 != 0);
    }
    usage();
    iVar2 = 2;
  }
LAB_0010239f:
  if (!bVar10) {
    if (argC < 3) {
      usage();
      iVar2 = 2;
    }
    else {
      pcVar8 = argV[(ulong)(uint)argC - 2];
      __s = argV[(ulong)(uint)argC - 1];
      xercesc_4_0::XMLPlatformUtils::Initialize
                ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,
                 (PanicHandler *)0x0,(MemoryManager *)0x0);
      plVar3 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
      plVar4 = (long *)(**(code **)(*plVar3 + 0x10))
                                 (plVar3,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0);
      plVar5 = (long *)(**(code **)(*plVar4 + 0x10))(plVar4);
      (**(code **)(*plVar5 + 8))(plVar5,&xercesc_4_0::XMLUni::fgDOMNamespaces,1);
      (**(code **)(*plVar5 + 8))(plVar5,&xercesc_4_0::XMLUni::fgXercesSchema,1);
      (**(code **)(*plVar5 + 8))(plVar5,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
      (**(code **)(*plVar5 + 8))(plVar5,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,1);
      cVar1 = (**(code **)(*plVar5 + 0x20))(plVar5,&xercesc_4_0::XMLUni::fgXercesDoXInclude,1);
      if (cVar1 != '\0') {
        (**(code **)(*plVar5 + 8))(plVar5,&xercesc_4_0::XMLUni::fgXercesDoXInclude,1);
      }
      (**(code **)*plVar5)(plVar5,&xercesc_4_0::XMLUni::fgDOMErrorHandler);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Parse ",6);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106130);
      }
      else {
        sVar6 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," in progress ...",0x10);
      (**(code **)(*plVar4 + 0x68))(plVar4);
      lVar7 = (**(code **)(*plVar4 + 0x48))(plVar4,pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," finished.",10);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      if (lVar7 != 0) {
        plVar5 = (long *)(**(code **)(*plVar3 + 0x18))
                                   (plVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        plVar3 = (long *)(**(code **)(*plVar3 + 0x28))
                                   (plVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Writing result to: ",0x13);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106130);
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar6);
        }
        cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
        uVar9 = (ulong)(uint)(int)cVar1;
        std::ostream::put('0');
        std::ostream::flush();
        this = (LocalFileFormatTarget *)xercesc_4_0::XMemory::operator_new((XMemory *)0x30,uVar9);
        xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
                  (this,__s,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        (**(code **)(*plVar3 + 0x28))(plVar3,this);
        (**(code **)(*plVar5 + 0x38))(plVar5,lVar7 + 0x18,plVar3);
        (**(code **)(*(long *)this + 8))(this);
        (**(code **)(*plVar5 + 0x50))(plVar5);
        (**(code **)(*plVar3 + 0x40))(plVar3);
      }
      (**(code **)(*plVar4 + 0x60))(plVar4);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int main(int argC, char* argV[])
{
	char						*testFileName;
	char						*outputFileName;

    for (int argInd = 1; argInd < argC; argInd++)
	{
        if (!strcmp(argV[argInd], "-?") || !strcmp(argV[argInd], "-h"))
        {
			/* print help and exit */
            usage();
            return 2;
        }
    }

	if (argC < 3){
		usage();
		return 2;
	}

	testFileName = argV[argC-2];
	outputFileName = argV[argC-1];

    // Initialize the XML4C system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! :\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

	//============================================================================
	// Instantiate the DOM parser to use for the source documents
	//============================================================================
    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementation *impl = DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *parser = ((DOMImplementationLS*)impl)->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMConfiguration  *config = parser->getDomConfig();

    config->setParameter(XMLUni::fgDOMNamespaces, true);
    config->setParameter(XMLUni::fgXercesSchema, true);
    config->setParameter(XMLUni::fgXercesHandleMultipleImports, true);
    config->setParameter(XMLUni::fgXercesSchemaFullChecking, true);

    if(config->canSetParameter(XMLUni::fgXercesDoXInclude, true)){
      config->setParameter(XMLUni::fgXercesDoXInclude, true);
    }

    // enable datatype normalization - default is off
    //config->setParameter(XMLUni::fgDOMDatatypeNormalization, true);

    // And create our error handler and install it
    XIncludeErrorHandler errorHandler;
    config->setParameter(XMLUni::fgDOMErrorHandler, &errorHandler);

    xercesc::DOMDocument *doc = 0;

    try
    {
        // load up the test source document
		std::cerr << "Parse " << testFileName << " in progress ...";
        parser->resetDocumentPool();
		doc = parser->parseURI(testFileName);
		std::cerr << " finished." << std::endl;
    }
    catch (const XMLException& toCatch)
    {
        std::cerr << "\nError during parsing: '" << testFileName << "'\n"
                << "Exception message is:  \n"
                << StrX(toCatch.getMessage()) << "\n" << std::endl;
    }
    catch (const DOMException& toCatch)
    {
        const unsigned int maxChars = 2047;
        XMLCh errText[maxChars + 1];

        std::cerr << "\nDOM Error during parsing: '" << testFileName << "'\n"
                << "DOMException code is:  " << toCatch.code << std::endl;

        if (DOMImplementation::loadDOMExceptionMsg(toCatch.code, errText, maxChars))
                std::cerr << "Message is: " << StrX(errText) << std::endl;

    }
    catch (...)
    {
        std::cerr << "\nUnexpected exception during parsing: '" << testFileName << "'\n";
    }

    if (!errorHandler.getSawErrors() && doc) {
	    DOMLSSerializer	*writer = ((DOMImplementationLS*)impl)->createLSSerializer();
	    DOMLSOutput     *theOutputDesc = ((DOMImplementationLS*)impl)->createLSOutput();

		try {
			// write out the results
			std::cerr << "Writing result to: " << outputFileName << std::endl;

			XMLFormatTarget *myFormTarget = new LocalFileFormatTarget(outputFileName);
			theOutputDesc->setByteStream(myFormTarget);
			writer->write(doc, theOutputDesc);
            delete myFormTarget;
		}
		catch (const XMLException& toCatch)
		{
		    std::cerr << "\nXMLException during writing: '" << testFileName << "'\n"
				<< "Exception message is:  \n"
				<< StrX(toCatch.getMessage()) << "\n" << std::endl;
		}
		catch (const DOMException& toCatch)
		{
			const unsigned int maxChars = 2047;
			XMLCh errText[maxChars + 1];

			std::cerr << "\nDOM Error during writing: '" << testFileName << "'\n"
				<< "DOMException code is:  " << toCatch.code << std::endl;

			if (DOMImplementation::loadDOMExceptionMsg(toCatch.code, errText, maxChars))
				std::cerr << "Message is: " << StrX(errText) << std::endl;
		}
		catch (...)
		{
			std::cerr << "\nUnexpected exception during writing: '" << testFileName << "'\n";
		}
        writer->release();
        theOutputDesc->release();
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    parser->release();
	// And call the termination method
    XMLPlatformUtils::Terminate();

    return 0;
}